

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O3

int z_deflate(z_streamp strm,int flush)

{
  z_Bytef zVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  deflate_state *s;
  z_Bytef *pzVar5;
  z_Bytef *pzVar6;
  z_Bytef *pzVar7;
  Posf *__s;
  bool bVar8;
  z_Bytef zVar9;
  z_uLong zVar10;
  block_state bVar11;
  gz_headerp pgVar12;
  uint uVar13;
  int iVar14;
  z_uInt zVar15;
  uint uVar16;
  ulong uVar17;
  z_uInt zVar18;
  
  if (strm == (z_streamp)0x0) {
    return -2;
  }
  s = strm->state;
  if (4 < (uint)flush || s == (deflate_state *)0x0) {
    return -2;
  }
  if ((strm->next_out == (z_Bytef *)0x0) ||
     (((strm->next_in == (z_Bytef *)0x0 && (strm->avail_in != 0)) ||
      (iVar14 = s->status, flush != 4 && iVar14 == 0x29a)))) {
    strm->msg = "stream error";
    return -2;
  }
  if (strm->avail_out == 0) {
LAB_0068ff08:
    strm->msg = "buffer error";
    iVar14 = -5;
  }
  else {
    s->strm = strm;
    iVar2 = s->last_flush;
    s->last_flush = flush;
    if (iVar14 == 0x2a) {
      if (s->wrap != 2) {
        uVar16 = s->w_bits * 0x1000 - 0x7800;
        uVar13 = 0;
        if ((s->strategy < 2) && (uVar4 = s->level, 1 < (int)uVar4)) {
          uVar13 = 0x40;
          if (5 < uVar4) {
            uVar13 = (uVar4 != 6 | 2) << 6;
          }
        }
        uVar4 = uVar13 + 0x20 + uVar16;
        if (s->strstart == 0) {
          uVar4 = uVar13 | uVar16;
        }
        s->status = 0x71;
        uVar16 = s->pending;
        s->pending = uVar16 + 1;
        s->pending_buf[uVar16] = (z_Bytef)(uVar4 >> 8);
        uVar16 = s->pending;
        s->pending = uVar16 + 1;
        s->pending_buf[uVar16] =
             (((char)(uVar4 / 0x1f) - (char)(uVar4 / 0x1f << 5)) + (byte)uVar4 | (byte)uVar4) ^ 0x1f
        ;
        if (s->strstart != 0) {
          zVar9 = *(z_Bytef *)((long)&strm->adler + 2);
          zVar1 = *(z_Bytef *)((long)&strm->adler + 3);
          uVar16 = s->pending;
          s->pending = uVar16 + 1;
          s->pending_buf[uVar16] = zVar1;
          uVar16 = s->pending;
          s->pending = uVar16 + 1;
          s->pending_buf[uVar16] = zVar9;
          zVar10 = strm->adler;
          uVar16 = s->pending;
          s->pending = uVar16 + 1;
          s->pending_buf[uVar16] = (z_Bytef)(zVar10 >> 8);
          uVar16 = s->pending;
          s->pending = uVar16 + 1;
          s->pending_buf[uVar16] = (z_Bytef)zVar10;
        }
        zVar10 = z_adler32(0,(z_Bytef *)0x0,0);
        strm->adler = zVar10;
        iVar14 = s->status;
        goto LAB_0068fb6c;
      }
      zVar10 = z_crc32(0,(uchar *)0x0,0);
      strm->adler = zVar10;
      uVar16 = s->pending;
      s->pending = uVar16 + 1;
      s->pending_buf[uVar16] = '\x1f';
      uVar16 = s->pending;
      s->pending = uVar16 + 1;
      s->pending_buf[uVar16] = 0x8b;
      uVar16 = s->pending;
      s->pending = uVar16 + 1;
      s->pending_buf[uVar16] = '\b';
      pgVar12 = s->gzhead;
      if (pgVar12 != (gz_headerp)0x0) {
        iVar14 = pgVar12->text;
        iVar3 = pgVar12->hcrc;
        pzVar5 = pgVar12->extra;
        pzVar6 = pgVar12->name;
        pzVar7 = pgVar12->comment;
        uVar16 = s->pending;
        s->pending = uVar16 + 1;
        s->pending_buf[uVar16] =
             (pzVar7 != (z_Bytef *)0x0) << 4 |
             (pzVar6 != (z_Bytef *)0x0) << 3 |
             (pzVar5 != (z_Bytef *)0x0) << 2 | (iVar3 != 0) * '\x02' | iVar14 != 0;
        zVar10 = s->gzhead->time;
        uVar16 = s->pending;
        s->pending = uVar16 + 1;
        s->pending_buf[uVar16] = (z_Bytef)zVar10;
        zVar9 = *(z_Bytef *)((long)&s->gzhead->time + 1);
        uVar16 = s->pending;
        s->pending = uVar16 + 1;
        s->pending_buf[uVar16] = zVar9;
        zVar9 = *(z_Bytef *)((long)&s->gzhead->time + 2);
        uVar16 = s->pending;
        s->pending = uVar16 + 1;
        s->pending_buf[uVar16] = zVar9;
        zVar9 = *(z_Bytef *)((long)&s->gzhead->time + 3);
        uVar16 = s->pending;
        s->pending = uVar16 + 1;
        s->pending_buf[uVar16] = zVar9;
        zVar9 = '\x02';
        if (s->level != 9) {
          zVar9 = (s->level < 2 || 1 < s->strategy) << 2;
        }
        uVar16 = s->pending;
        s->pending = uVar16 + 1;
        s->pending_buf[uVar16] = zVar9;
        iVar14 = s->gzhead->os;
        uVar16 = s->pending;
        s->pending = uVar16 + 1;
        s->pending_buf[uVar16] = (z_Bytef)iVar14;
        pgVar12 = s->gzhead;
        if (pgVar12->extra != (z_Bytef *)0x0) {
          zVar15 = pgVar12->extra_len;
          uVar16 = s->pending;
          s->pending = uVar16 + 1;
          s->pending_buf[uVar16] = (z_Bytef)zVar15;
          zVar9 = *(z_Bytef *)((long)&s->gzhead->extra_len + 1);
          uVar16 = s->pending;
          s->pending = uVar16 + 1;
          s->pending_buf[uVar16] = zVar9;
          pgVar12 = s->gzhead;
        }
        if (pgVar12->hcrc != 0) {
          zVar10 = z_crc32(strm->adler,s->pending_buf,s->pending);
          strm->adler = zVar10;
        }
        s->gzindex = 0;
        s->status = 0x45;
        goto LAB_0068fb75;
      }
      uVar16 = s->pending;
      s->pending = uVar16 + 1;
      s->pending_buf[uVar16] = '\0';
      uVar16 = s->pending;
      s->pending = uVar16 + 1;
      s->pending_buf[uVar16] = '\0';
      uVar16 = s->pending;
      s->pending = uVar16 + 1;
      s->pending_buf[uVar16] = '\0';
      uVar16 = s->pending;
      s->pending = uVar16 + 1;
      s->pending_buf[uVar16] = '\0';
      uVar16 = s->pending;
      s->pending = uVar16 + 1;
      s->pending_buf[uVar16] = '\0';
      zVar9 = '\x02';
      if (s->level != 9) {
        zVar9 = (s->level < 2 || 1 < s->strategy) << 2;
      }
      uVar16 = s->pending;
      s->pending = uVar16 + 1;
      s->pending_buf[uVar16] = zVar9;
      uVar16 = s->pending;
      s->pending = uVar16 + 1;
      s->pending_buf[uVar16] = '\x03';
LAB_0068fec3:
      s->status = 0x71;
    }
    else {
LAB_0068fb6c:
      if (iVar14 == 0x45) {
LAB_0068fb75:
        pgVar12 = s->gzhead;
        if (pgVar12->extra != (z_Bytef *)0x0) {
          zVar15 = s->pending;
          zVar18 = s->gzindex;
          while (zVar18 < (ushort)pgVar12->extra_len) {
            uVar16 = s->pending;
            if (uVar16 == s->pending_buf_size) {
              if ((pgVar12->hcrc != 0) && (zVar15 <= uVar16 && uVar16 - zVar15 != 0)) {
                zVar10 = z_crc32(strm->adler,s->pending_buf + zVar15,uVar16 - zVar15);
                strm->adler = zVar10;
              }
              flush_pending(strm);
              zVar15 = s->pending;
              pgVar12 = s->gzhead;
              if (zVar15 == s->pending_buf_size) break;
              zVar18 = s->gzindex;
              uVar16 = zVar15;
            }
            zVar9 = pgVar12->extra[zVar18];
            s->pending = uVar16 + 1;
            s->pending_buf[uVar16] = zVar9;
            zVar18 = s->gzindex + 1;
            s->gzindex = zVar18;
            pgVar12 = s->gzhead;
          }
          if ((pgVar12->hcrc != 0) &&
             (uVar16 = s->pending - zVar15, zVar15 <= s->pending && uVar16 != 0)) {
            zVar10 = z_crc32(strm->adler,s->pending_buf + zVar15,uVar16);
            strm->adler = zVar10;
            pgVar12 = s->gzhead;
          }
          if (s->gzindex != pgVar12->extra_len) {
            iVar14 = s->status;
            goto LAB_0068fcd9;
          }
          s->gzindex = 0;
        }
        s->status = 0x49;
LAB_0068fce6:
        if (pgVar12->name != (z_Bytef *)0x0) {
          zVar15 = s->pending;
          do {
            uVar16 = s->pending;
            pgVar12 = s->gzhead;
            if (uVar16 == s->pending_buf_size) {
              if ((pgVar12->hcrc != 0) && (zVar15 <= uVar16 && uVar16 - zVar15 != 0)) {
                zVar10 = z_crc32(strm->adler,s->pending_buf + zVar15,uVar16 - zVar15);
                strm->adler = zVar10;
              }
              flush_pending(strm);
              zVar15 = s->pending;
              if (zVar15 == s->pending_buf_size) {
                bVar8 = false;
                goto LAB_0068fd60;
              }
              pgVar12 = s->gzhead;
              uVar16 = zVar15;
            }
            pzVar5 = pgVar12->name;
            uVar13 = s->gzindex;
            s->gzindex = uVar13 + 1;
            zVar9 = pzVar5[uVar13];
            s->pending = uVar16 + 1;
            s->pending_buf[uVar16] = zVar9;
          } while (zVar9 != '\0');
          bVar8 = true;
LAB_0068fd60:
          if ((s->gzhead->hcrc != 0) &&
             (uVar16 = s->pending - zVar15, zVar15 <= s->pending && uVar16 != 0)) {
            zVar10 = z_crc32(strm->adler,s->pending_buf + zVar15,uVar16);
            strm->adler = zVar10;
          }
          if (!bVar8) {
            iVar14 = s->status;
            goto LAB_0068fd9e;
          }
          s->gzindex = 0;
        }
        s->status = 0x5b;
LAB_0068fda7:
        if (s->gzhead->comment != (z_Bytef *)0x0) {
          zVar15 = s->pending;
          do {
            uVar16 = s->pending;
            pgVar12 = s->gzhead;
            if (uVar16 == s->pending_buf_size) {
              if ((pgVar12->hcrc != 0) && (zVar15 <= uVar16 && uVar16 - zVar15 != 0)) {
                zVar10 = z_crc32(strm->adler,s->pending_buf + zVar15,uVar16 - zVar15);
                strm->adler = zVar10;
              }
              flush_pending(strm);
              zVar15 = s->pending;
              if (zVar15 == s->pending_buf_size) {
                bVar8 = false;
                goto LAB_0068fe25;
              }
              pgVar12 = s->gzhead;
              uVar16 = zVar15;
            }
            pzVar5 = pgVar12->comment;
            uVar13 = s->gzindex;
            s->gzindex = uVar13 + 1;
            zVar9 = pzVar5[uVar13];
            s->pending = uVar16 + 1;
            s->pending_buf[uVar16] = zVar9;
          } while (zVar9 != '\0');
          bVar8 = true;
LAB_0068fe25:
          if ((s->gzhead->hcrc != 0) &&
             (uVar16 = s->pending - zVar15, zVar15 <= s->pending && uVar16 != 0)) {
            zVar10 = z_crc32(strm->adler,s->pending_buf + zVar15,uVar16);
            strm->adler = zVar10;
          }
          if (!bVar8) {
            iVar14 = s->status;
            goto LAB_0068fe5c;
          }
        }
        s->status = 0x67;
LAB_0068fe61:
        if (s->gzhead->hcrc != 0) {
          uVar13 = s->pending_buf_size;
          zVar15 = s->pending;
          uVar16 = zVar15 + 2;
          if (uVar13 < uVar16) {
            flush_pending(strm);
            uVar13 = s->pending_buf_size;
            zVar15 = s->pending;
            uVar16 = zVar15 + 2;
          }
          if (uVar13 < uVar16) goto LAB_0068feca;
          zVar10 = strm->adler;
          s->pending = zVar15 + 1;
          s->pending_buf[zVar15] = (z_Bytef)zVar10;
          zVar9 = *(z_Bytef *)((long)&strm->adler + 1);
          uVar16 = s->pending;
          s->pending = uVar16 + 1;
          s->pending_buf[uVar16] = zVar9;
          zVar10 = z_crc32(0,(uchar *)0x0,0);
          strm->adler = zVar10;
        }
        goto LAB_0068fec3;
      }
LAB_0068fcd9:
      if (iVar14 == 0x49) {
        pgVar12 = s->gzhead;
        goto LAB_0068fce6;
      }
LAB_0068fd9e:
      if (iVar14 == 0x5b) goto LAB_0068fda7;
LAB_0068fe5c:
      if (iVar14 == 0x67) goto LAB_0068fe61;
    }
LAB_0068feca:
    if (s->pending == 0) {
      if (((strm->avail_in == 0) && (flush != 4)) && (flush <= iVar2)) goto LAB_0068ff08;
LAB_0068fee3:
      if (s->status == 0x29a) {
        if (strm->avail_in != 0) goto LAB_0068ff08;
LAB_0068ff25:
        if (s->lookahead != 0) goto LAB_0068ff2e;
        if (flush != 0) {
          if (s->status != 0x29a) goto LAB_0068ff2e;
          goto LAB_0068ffdb;
        }
      }
      else {
        if (strm->avail_in == 0) goto LAB_0068ff25;
LAB_0068ff2e:
        bVar11 = (*configuration_table[s->level].func)(s,flush);
        if ((bVar11 & ~block_done) == finish_started) {
          s->status = 0x29a;
        }
        if ((bVar11 & ~finish_started) == need_more) {
          if (strm->avail_out != 0) {
            return 0;
          }
          s->last_flush = -1;
          return 0;
        }
        if (bVar11 == block_done) {
          if (flush == 1) {
            _tr_align(s);
          }
          else {
            _tr_stored_block(s,(z_charf *)0x0,0,0);
            if (flush == 3) {
              __s = s->head;
              uVar17 = (ulong)(s->hash_size - 1);
              __s[uVar17] = 0;
              memset(__s,0,uVar17 * 2);
            }
          }
          flush_pending(strm);
          if (strm->avail_out == 0) goto LAB_0069008b;
        }
LAB_0068ffdb:
        if (flush == 4) {
          if (0 < s->wrap) {
            zVar10 = strm->adler;
            if (s->wrap == 2) {
              uVar16 = s->pending;
              s->pending = uVar16 + 1;
              s->pending_buf[uVar16] = (z_Bytef)zVar10;
              zVar9 = *(z_Bytef *)((long)&strm->adler + 1);
              uVar16 = s->pending;
              s->pending = uVar16 + 1;
              s->pending_buf[uVar16] = zVar9;
              zVar9 = *(z_Bytef *)((long)&strm->adler + 2);
              uVar16 = s->pending;
              s->pending = uVar16 + 1;
              s->pending_buf[uVar16] = zVar9;
              zVar9 = *(z_Bytef *)((long)&strm->adler + 3);
              uVar16 = s->pending;
              s->pending = uVar16 + 1;
              s->pending_buf[uVar16] = zVar9;
              zVar10 = strm->total_in;
              uVar16 = s->pending;
              s->pending = uVar16 + 1;
              s->pending_buf[uVar16] = (z_Bytef)zVar10;
              zVar9 = *(z_Bytef *)((long)&strm->total_in + 1);
              uVar16 = s->pending;
              s->pending = uVar16 + 1;
              s->pending_buf[uVar16] = zVar9;
              zVar9 = *(z_Bytef *)((long)&strm->total_in + 2);
              uVar16 = s->pending;
              s->pending = uVar16 + 1;
              s->pending_buf[uVar16] = zVar9;
              uVar16 = (uint)*(byte *)((long)&strm->total_in + 3);
            }
            else {
              uVar16 = s->pending;
              s->pending = uVar16 + 1;
              s->pending_buf[uVar16] = (z_Bytef)(zVar10 >> 0x18);
              uVar16 = s->pending;
              s->pending = uVar16 + 1;
              s->pending_buf[uVar16] = (z_Bytef)(zVar10 >> 0x10);
              uVar16 = strm->adler;
              uVar13 = s->pending;
              s->pending = uVar13 + 1;
              s->pending_buf[uVar13] = (z_Bytef)(uVar16 >> 8);
            }
            uVar13 = s->pending;
            s->pending = uVar13 + 1;
            s->pending_buf[uVar13] = (z_Bytef)uVar16;
            flush_pending(strm);
            if (0 < s->wrap) {
              s->wrap = -s->wrap;
            }
            return (uint)(s->pending == 0);
          }
          return 1;
        }
      }
    }
    else {
      flush_pending(strm);
      if (strm->avail_out != 0) goto LAB_0068fee3;
LAB_0069008b:
      s->last_flush = -1;
    }
    iVar14 = 0;
  }
  return iVar14;
}

Assistant:

int ZEXPORT deflate (strm, flush)
    z_streamp strm;
    int flush;
{
    int old_flush; /* value of flush param for previous deflate call */
    deflate_state *s;

    if (strm == Z_NULL || strm->state == Z_NULL ||
        flush > Z_FINISH || flush < 0) {
        return Z_STREAM_ERROR;
    }
    s = strm->state;

    if (strm->next_out == Z_NULL ||
        (strm->next_in == Z_NULL && strm->avail_in != 0) ||
        (s->status == FINISH_STATE && flush != Z_FINISH)) {
        ERR_RETURN(strm, Z_STREAM_ERROR);
    }
    if (strm->avail_out == 0) ERR_RETURN(strm, Z_BUF_ERROR);

    s->strm = strm; /* just in case */
    old_flush = s->last_flush;
    s->last_flush = flush;

    /* Write the header */
    if (s->status == INIT_STATE) {
#ifdef GZIP
        if (s->wrap == 2) {
            strm->adler = crc32(0L, Z_NULL, 0);
            put_byte(s, 31);
            put_byte(s, 139);
            put_byte(s, 8);
            if (0 == s->gzhead) {
                put_byte(s, 0);
                put_byte(s, 0);
                put_byte(s, 0);
                put_byte(s, 0);
                put_byte(s, 0);
                put_byte(s, s->level == 9 ? 2 :
                            (s->strategy >= Z_HUFFMAN_ONLY || s->level < 2 ?
                             4 : 0));
                put_byte(s, OS_CODE);
                s->status = BUSY_STATE;
            }
            else {
                put_byte(s, (s->gzhead->text ? 1 : 0) +
                            (s->gzhead->hcrc ? 2 : 0) +
                            (s->gzhead->extra == Z_NULL ? 0 : 4) +
                            (s->gzhead->name == Z_NULL ? 0 : 8) +
                            (s->gzhead->comment == Z_NULL ? 0 : 16)
                        );
                put_byte(s, (s->gzhead->time & 0xff));
                put_byte(s, ((s->gzhead->time >> 8) & 0xff));
                put_byte(s, ((s->gzhead->time >> 16) & 0xff));
                put_byte(s, ((s->gzhead->time >> 24) & 0xff));
                put_byte(s, s->level == 9 ? 2 :
                            (s->strategy >= Z_HUFFMAN_ONLY || s->level < 2 ?
                             4 : 0));
                put_byte(s, s->gzhead->os & 0xff);
                if (s->gzhead->extra != 0) {
                    put_byte(s, s->gzhead->extra_len & 0xff);
                    put_byte(s, (s->gzhead->extra_len >> 8) & 0xff);
                }
                if (s->gzhead->hcrc)
                    strm->adler = crc32(strm->adler, s->pending_buf,
                                        s->pending);
                s->gzindex = 0;
                s->status = EXTRA_STATE;
            }
        }
        else
#endif
        {
            uInt header = (Z_DEFLATED + ((s->w_bits-8)<<4)) << 8;
            uInt level_flags;

            if (s->strategy >= Z_HUFFMAN_ONLY || s->level < 2)
                level_flags = 0;
            else if (s->level < 6)
                level_flags = 1;
            else if (s->level == 6)
                level_flags = 2;
            else
                level_flags = 3;
            header |= (level_flags << 6);
            if (s->strstart != 0) header |= PRESET_DICT;
            header += 31 - (header % 31);

            s->status = BUSY_STATE;
            putShortMSB(s, header);

            /* Save the adler32 of the preset dictionary: */
            if (s->strstart != 0) {
                putShortMSB(s, (uInt)(strm->adler >> 16));
                putShortMSB(s, (uInt)(strm->adler & 0xffff));
            }
            strm->adler = adler32(0L, Z_NULL, 0);
        }
    }
#ifdef GZIP
    if (s->status == EXTRA_STATE) {
        if (s->gzhead->extra != 0) {
            uInt beg = s->pending;  /* start of bytes to update crc */

            while (s->gzindex < (s->gzhead->extra_len & 0xffff)) {
                if (s->pending == s->pending_buf_size) {
                    if (s->gzhead->hcrc && s->pending > beg)
                        strm->adler = crc32(strm->adler, s->pending_buf + beg,
                                            s->pending - beg);
                    flush_pending(strm);
                    beg = s->pending;
                    if (s->pending == s->pending_buf_size)
                        break;
                }
                put_byte(s, s->gzhead->extra[s->gzindex]);
                s->gzindex++;
            }
            if (s->gzhead->hcrc && s->pending > beg)
                strm->adler = crc32(strm->adler, s->pending_buf + beg,
                                    s->pending - beg);
            if (s->gzindex == s->gzhead->extra_len) {
                s->gzindex = 0;
                s->status = NAME_STATE;
            }
        }
        else
            s->status = NAME_STATE;
    }
    if (s->status == NAME_STATE) {
        if (s->gzhead->name != 0) {
            uInt beg = s->pending;  /* start of bytes to update crc */
            int val;

            do {
                if (s->pending == s->pending_buf_size) {
                    if (s->gzhead->hcrc && s->pending > beg)
                        strm->adler = crc32(strm->adler, s->pending_buf + beg,
                                            s->pending - beg);
                    flush_pending(strm);
                    beg = s->pending;
                    if (s->pending == s->pending_buf_size) {
                        val = 1;
                        break;
                    }
                }
                val = s->gzhead->name[s->gzindex++];
                put_byte(s, val);
            } while (val != 0);
            if (s->gzhead->hcrc && s->pending > beg)
                strm->adler = crc32(strm->adler, s->pending_buf + beg,
                                    s->pending - beg);
            if (val == 0) {
                s->gzindex = 0;
                s->status = COMMENT_STATE;
            }
        }
        else
            s->status = COMMENT_STATE;
    }
    if (s->status == COMMENT_STATE) {
        if (s->gzhead->comment != 0) {
            uInt beg = s->pending;  /* start of bytes to update crc */
            int val;

            do {
                if (s->pending == s->pending_buf_size) {
                    if (s->gzhead->hcrc && s->pending > beg)
                        strm->adler = crc32(strm->adler, s->pending_buf + beg,
                                            s->pending - beg);
                    flush_pending(strm);
                    beg = s->pending;
                    if (s->pending == s->pending_buf_size) {
                        val = 1;
                        break;
                    }
                }
                val = s->gzhead->comment[s->gzindex++];
                put_byte(s, val);
            } while (val != 0);
            if (s->gzhead->hcrc && s->pending > beg)
                strm->adler = crc32(strm->adler, s->pending_buf + beg,
                                    s->pending - beg);
            if (val == 0)
                s->status = HCRC_STATE;
        }
        else
            s->status = HCRC_STATE;
    }
    if (s->status == HCRC_STATE) {
        if (s->gzhead->hcrc) {
            if (s->pending + 2 > s->pending_buf_size)
                flush_pending(strm);
            if (s->pending + 2 <= s->pending_buf_size) {
                put_byte(s, (strm->adler & 0xff));
                put_byte(s, ((strm->adler >> 8) & 0xff));
                strm->adler = crc32(0L, Z_NULL, 0);
                s->status = BUSY_STATE;
            }
        }
        else
            s->status = BUSY_STATE;
    }
#endif

    /* Flush as much pending output as possible */
    if (s->pending != 0) {
        flush_pending(strm);
        if (strm->avail_out == 0) {
            /* Since avail_out is 0, deflate will be called again with
             * more output space, but possibly with both pending and
             * avail_in equal to zero. There won't be anything to do,
             * but this is not an error situation so make sure we
             * return OK instead of BUF_ERROR at next call of deflate:
             */
            s->last_flush = -1;
            return Z_OK;
        }

    /* Make sure there is something to do and avoid duplicate consecutive
     * flushes. For repeated and useless calls with Z_FINISH, we keep
     * returning Z_STREAM_END instead of Z_BUF_ERROR.
     */
    } else if (strm->avail_in == 0 && flush <= old_flush &&
               flush != Z_FINISH) {
        ERR_RETURN(strm, Z_BUF_ERROR);
    }

    /* User must not provide more input after the first FINISH: */
    if (s->status == FINISH_STATE && strm->avail_in != 0) {
        ERR_RETURN(strm, Z_BUF_ERROR);
    }

    /* Start a new block or continue the current one.
     */
    if (strm->avail_in != 0 || s->lookahead != 0 ||
        (flush != Z_NO_FLUSH && s->status != FINISH_STATE)) {
        block_state bstate;

        bstate = (*(configuration_table[s->level].func))(s, flush);

        if (bstate == finish_started || bstate == finish_done) {
            s->status = FINISH_STATE;
        }
        if (bstate == need_more || bstate == finish_started) {
            if (strm->avail_out == 0) {
                s->last_flush = -1; /* avoid BUF_ERROR next call, see above */
            }
            return Z_OK;
            /* If flush != Z_NO_FLUSH && avail_out == 0, the next call
             * of deflate should use the same flush parameter to make sure
             * that the flush is complete. So we don't have to output an
             * empty block here, this will be done at next call. This also
             * ensures that for a very small output buffer, we emit at most
             * one empty block.
             */
        }
        if (bstate == block_done) {
            if (flush == Z_PARTIAL_FLUSH) {
                _tr_align(s);
            } else { /* FULL_FLUSH or SYNC_FLUSH */
                _tr_stored_block(s, (char*)0, 0L, 0);
                /* For a full flush, this empty block will be recognized
                 * as a special marker by inflate_sync().
                 */
                if (flush == Z_FULL_FLUSH) {
                    CLEAR_HASH(s);             /* forget history */
                }
            }
            flush_pending(strm);
            if (strm->avail_out == 0) {
              s->last_flush = -1; /* avoid BUF_ERROR at next call, see above */
              return Z_OK;
            }
        }
    }
    Assert(strm->avail_out > 0, "bug2");

    if (flush != Z_FINISH) return Z_OK;
    if (s->wrap <= 0) return Z_STREAM_END;

    /* Write the trailer */
#ifdef GZIP
    if (s->wrap == 2) {
        put_byte(s, (strm->adler & 0xff));
        put_byte(s, ((strm->adler >> 8) & 0xff));
        put_byte(s, ((strm->adler >> 16) & 0xff));
        put_byte(s, ((strm->adler >> 24) & 0xff));
        put_byte(s, (strm->total_in & 0xff));
        put_byte(s, ((strm->total_in >> 8) & 0xff));
        put_byte(s, ((strm->total_in >> 16) & 0xff));
        put_byte(s, ((strm->total_in >> 24) & 0xff));
    }
    else
#endif
    {
        putShortMSB(s, (uInt)(strm->adler >> 16));
        putShortMSB(s, (uInt)(strm->adler & 0xffff));
    }
    flush_pending(strm);
    /* If avail_out is zero, the application will call deflate again
     * to flush the rest.
     */
    if (s->wrap > 0) s->wrap = -s->wrap; /* write the trailer only once! */
    return s->pending != 0 ? Z_OK : Z_STREAM_END;
}